

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O1

ssize_t sendto(int __fd,void *__buf,size_t __n,int __flags,sockaddr *__addr,socklen_t __addr_len)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  int *piVar4;
  ssize_t sVar5;
  ulong uVar6;
  rpchook_t *prVar7;
  ulong uVar8;
  pollfd pf;
  pollfd local_48;
  socklen_t local_3c;
  sockaddr *local_38;
  
  if (g_sys_sendto_func == (sendto_pfn_t)0x0) {
    g_sys_sendto_func = (sendto_pfn_t)dlsym(0xffffffffffffffff,"sendto");
  }
  bVar2 = co_is_enable_sys_hook();
  if (bVar2) {
    if ((uint)__fd < 1000000) {
      prVar7 = g_rpchook_socket_fd[(uint)__fd];
    }
    else {
      prVar7 = (rpchook_t *)0x0;
    }
    if ((prVar7 != (rpchook_t *)0x0) && ((prVar7->user_flag & 0x800) == 0)) {
      local_38 = __addr;
      uVar3 = (*g_sys_sendto_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
      if (((long)uVar3 < 0) && (piVar4 = __errno_location(), *piVar4 == 0xb)) {
        uVar3 = 0;
      }
      uVar8 = uVar3;
      local_3c = __addr_len;
      if (-1 < (long)uVar3) {
        do {
          if (__n <= uVar8) break;
          auVar1 = SEXT816(0x20c49ba5e353f7cf) * SEXT816((prVar7->write_timeout).tv_usec);
          local_48.events = 0x1c;
          local_48.fd = __fd;
          local_48.revents = 0;
          poll(&local_48,1,
               ((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)) +
               (int)(prVar7->write_timeout).tv_sec * 1000);
          uVar3 = (*g_sys_sendto_func)(__fd,__buf,__n,__flags,(sockaddr *)local_38,local_3c);
          if ((long)uVar3 < 0) {
            piVar4 = __errno_location();
            if (*piVar4 == 0xb) {
              *piVar4 = 0x7c5;
            }
          }
          else {
            uVar8 = uVar8 + uVar3;
          }
        } while (-1 < (long)uVar3);
        uVar6 = uVar8;
        if (uVar8 == 0) {
          uVar6 = uVar3;
        }
        if ((long)uVar3 < 1) {
          uVar8 = uVar6;
        }
      }
      return uVar8;
    }
  }
  sVar5 = (*g_sys_sendto_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
  return sVar5;
}

Assistant:

ssize_t sendto(int socket, const void *message, size_t length,
	                 int flags, const struct sockaddr *dest_addr,
					               socklen_t dest_len)
{
	/*
		1.no enable sys call ? sys
		2.( !lp || lp is non block ) ? sys
		3.try
		4.wait
		5.try
	*/
	HOOK_SYS_FUNC( sendto );
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );
	}

	rpchook_t *lp = get_by_fd( socket );
	if( !lp || ( O_NONBLOCK & lp->user_flag ) )
	{
		return g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );
	}

	ssize_t ret = g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );

	if( ret < 0 && (EAGAIN == errno || EWOULDBLOCK == errno)){
		ret = 0;
	}

	if(ret<0) return ret;

	size_t bytes_written = ret;
	while(bytes_written < length){
		int timeout = ( lp->write_timeout.tv_sec * 1000 ) 
					+ ( lp->write_timeout.tv_usec / 1000 );


		struct pollfd pf = { 0 };
		pf.fd = socket;
		pf.events = ( POLLOUT | POLLERR | POLLHUP );
		poll( &pf,1,timeout );

		ret = g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );
		if(ret <0 ){
			//timeout from co_routine_poll, errno set to indicate special value
			if( errno == EAGAIN  || errno == EWOULDBLOCK ){
				//poll timed out , the socket is still unwritable
				errno = LIBCO_POLL_TIMEOUT;
			}
			break;
		}
		bytes_written += ret ;
	}
	if (ret <= 0 && bytes_written == 0){
		return ret;
	}
	return bytes_written;
}